

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeStringConstructor
               (DynamicObject *stringConstructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  undefined8 in_RAX;
  uint uVar3;
  PropertyString *pPVar1;
  JavascriptFunction *pJVar2;
  ScriptContext *pSVar4;
  ulong uVar5;
  
  uVar3 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,stringConstructor,mode,6,0);
  this = (((stringConstructor->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pSVar4 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  uVar5 = (ulong)uVar3 << 0x20;
  (*(stringConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])(stringConstructor,0xd1,&DAT_1000000000001,2,0,0,uVar5);
  uVar5 = uVar5 & 0xffffffff00000000;
  (*(stringConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])
            (stringConstructor,0x124,(this->super_JavascriptLibraryBase).stringPrototype.ptr,0,0,0,
             uVar5);
  pPVar1 = ScriptContext::GetPropertyString(pSVar4,0x15c);
  (*(stringConstructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
    ._vptr_IRecyclerVisitedObject[0x1e])
            (stringConstructor,0x106,pPVar1,2,0,0,uVar5 & 0xffffffff00000000);
  pJVar2 = AddFunctionToLibraryObject
                     (this,stringConstructor,0x96,
                      (FunctionInfo *)JavascriptString::EntryInfo::FromCharCode,1,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
            ((WriteBarrierPtr<Js::JavascriptFunction> *)&this->field_0x6a8,pJVar2);
  if (((pSVar4->config).threadConfig)->m_ES6Unicode == true) {
    pJVar2 = AddFunctionToLibraryObject
                       (this,stringConstructor,0x97,
                        (FunctionInfo *)JavascriptString::EntryInfo::FromCodePoint,1,'\x06');
    Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
              ((WriteBarrierPtr<Js::JavascriptFunction> *)&this->field_0x6b0,pJVar2);
  }
  pSVar4 = (ScriptContext *)stringConstructor;
  AddFunctionToLibraryObject
            (this,stringConstructor,0x12a,(FunctionInfo *)JavascriptString::EntryInfo::Raw,1,'\x06')
  ;
  CheckRegisteredBuiltIns((Type *)&this->field_0x650,pSVar4);
  DynamicObject::SetHasNoEnumerableProperties(stringConstructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeStringConstructor(DynamicObject* stringConstructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(stringConstructor, mode, 6);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterString
        // so that the update is in sync with profiler
        JavascriptLibrary* library = stringConstructor->GetLibrary();
        ScriptContext* scriptContext = stringConstructor->GetScriptContext();

        Field(JavascriptFunction*)* builtinFuncs = library->GetBuiltinFunctions();
        library->AddMember(stringConstructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(stringConstructor, PropertyIds::prototype, library->stringPrototype, PropertyNone);
        library->AddMember(stringConstructor, PropertyIds::name, scriptContext->GetPropertyString(PropertyIds::String), PropertyConfigurable);

        builtinFuncs[BuiltinFunction::JavascriptString_FromCharCode]  = library->AddFunctionToLibraryObject(stringConstructor, PropertyIds::fromCharCode,  &JavascriptString::EntryInfo::FromCharCode,  1);
        if(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
        {
            builtinFuncs[BuiltinFunction::JavascriptString_FromCodePoint] = library->AddFunctionToLibraryObject(stringConstructor, PropertyIds::fromCodePoint, &JavascriptString::EntryInfo::FromCodePoint, 1);
        }

        /* No inlining                String_Raw           */ library->AddFunctionToLibraryObject(stringConstructor, PropertyIds::raw,           &JavascriptString::EntryInfo::Raw,           1);

        DebugOnly(CheckRegisteredBuiltIns(builtinFuncs, scriptContext));

        stringConstructor->SetHasNoEnumerableProperties(true);

        return true;
    }